

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectiveSkip::writeTempData(CDirectiveSkip *this,TempData *tempData)

{
  int64_t memoryAddress;
  string local_38;
  
  memoryAddress = this->virtualAddress;
  tinyformat::format<long>(&local_38,".skip 0x%08X",&this->value);
  TempData::writeLine(tempData,memoryAddress,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CDirectiveSkip::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".skip 0x%08X",value));
}